

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,true,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  uhugeint_t shift;
  uhugeint_t shift_00;
  bool bVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uhugeint_t uVar9;
  uint64_t in_stack_ffffffffffffff58;
  uint64_t uStack_a0;
  uhugeint_t local_98;
  uhugeint_t *local_88;
  uhugeint_t *local_80;
  uhugeint_t local_78;
  ulong local_60;
  uint64_t local_58;
  uint64_t uStack_50;
  ValidityMask *local_48;
  ulong local_40;
  ulong local_38;
  
  local_88 = ldata;
  local_80 = result_data;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_58 = ldata->lower;
      uStack_50 = ldata->upper;
      lVar8 = 0;
      do {
        local_98.lower = *(uint64_t *)((long)&rdata->lower + lVar8);
        local_98.upper = *(uint64_t *)((long)&rdata->upper + lVar8);
        local_78.lower = local_58;
        local_78.upper = uStack_50;
        uVar9.upper = in_stack_ffffffffffffff58;
        uVar9.lower = 0x1042e91;
        bVar3 = RightShiftInRange<duckdb::uhugeint_t>(uVar9);
        if (bVar3) {
          uVar9 = uhugeint_t::operator>>(&local_78,&local_98);
          in_stack_ffffffffffffff58 = uVar9.lower;
          uStack_a0 = uVar9.upper;
        }
        else {
          uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff58,0);
        }
        puVar1 = (uint64_t *)((long)&local_80->lower + lVar8);
        *puVar1 = in_stack_ffffffffffffff58;
        puVar1[1] = uStack_a0;
        lVar8 = lVar8 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_38 = 0;
    uVar6 = 0;
    local_48 = mask;
    local_40 = count;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = puVar2[local_38];
      }
      uVar4 = uVar6 + 0x40;
      if (local_40 <= uVar6 + 0x40) {
        uVar4 = local_40;
      }
      uVar7 = uVar4;
      if (uVar5 != 0) {
        uVar7 = uVar6;
        if (uVar5 == 0xffffffffffffffff) {
          if (uVar6 < uVar4) {
            local_58 = local_88->lower;
            uStack_50 = local_88->upper;
            lVar8 = uVar6 << 4;
            do {
              local_98.lower = *(uint64_t *)((long)&rdata->lower + lVar8);
              local_98.upper = *(uint64_t *)((long)&rdata->upper + lVar8);
              local_78.lower = local_58;
              local_78.upper = uStack_50;
              shift.upper = in_stack_ffffffffffffff58;
              shift.lower = 0x1042d59;
              bVar3 = RightShiftInRange<duckdb::uhugeint_t>(shift);
              if (bVar3) {
                uVar9 = uhugeint_t::operator>>(&local_78,&local_98);
                in_stack_ffffffffffffff58 = uVar9.lower;
                uStack_a0 = uVar9.upper;
              }
              else {
                uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff58,0);
              }
              puVar1 = (uint64_t *)((long)&local_80->lower + lVar8);
              *puVar1 = in_stack_ffffffffffffff58;
              puVar1[1] = uStack_a0;
              uVar7 = uVar7 + 1;
              lVar8 = lVar8 + 0x10;
            } while (uVar4 != uVar7);
          }
        }
        else if (uVar6 < uVar4) {
          lVar8 = uVar6 << 4;
          uVar7 = 0;
          do {
            if ((uVar5 >> (uVar7 & 0x3f) & 1) != 0) {
              local_98.lower = *(uint64_t *)((long)&rdata->lower + lVar8);
              local_98.upper = *(uint64_t *)((long)&rdata->upper + lVar8);
              local_78.lower = local_88->lower;
              local_78.upper = local_88->upper;
              shift_00.upper = in_stack_ffffffffffffff58;
              shift_00.lower = 0x1042de8;
              bVar3 = RightShiftInRange<duckdb::uhugeint_t>(shift_00);
              if (bVar3) {
                uVar9 = uhugeint_t::operator>>(&local_78,&local_98);
                in_stack_ffffffffffffff58 = uVar9.lower;
                uStack_a0 = uVar9.upper;
              }
              else {
                uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff58,0);
              }
              puVar1 = (uint64_t *)((long)&local_80->lower + lVar8);
              *puVar1 = in_stack_ffffffffffffff58;
              puVar1[1] = uStack_a0;
            }
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 0x10;
          } while ((uVar6 - uVar4) + uVar7 != 0);
          mask = local_48;
          uVar7 = uVar6 + uVar7;
        }
      }
      local_38 = local_38 + 1;
      uVar6 = uVar7;
    } while (local_38 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}